

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O2

void term_destination(j_compress_ptr cinfo)

{
  jpeg_destination_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  size_t sVar4;
  size_t __n;
  
  pjVar1 = cinfo->dest;
  if (pjVar1->free_in_buffer != 0x1000) {
    __n = 0x1000 - pjVar1->free_in_buffer;
    sVar4 = fwrite((void *)pjVar1[1].free_in_buffer,1,__n,(FILE *)pjVar1[1].next_output_byte);
    if (sVar4 != __n) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x26;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
  }
  fflush((FILE *)pjVar1[1].next_output_byte);
  iVar3 = ferror((FILE *)pjVar1[1].next_output_byte);
  if (iVar3 != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x26;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
    return;
  }
  return;
}

Assistant:

METHODDEF(void)
term_destination (j_compress_ptr cinfo)
{
  my_dest_ptr dest = (my_dest_ptr) cinfo->dest;
  size_t datacount = OUTPUT_BUF_SIZE - dest->pub.free_in_buffer;

  /* Write any data remaining in the buffer */
  if (datacount > 0) {
    if (JFWRITE(dest->outfile, dest->buffer, datacount) != datacount)
      ERREXIT(cinfo, JERR_FILE_WRITE);
  }
  fflush(dest->outfile);
  /* Make sure we wrote the output file OK */
  if (ferror(dest->outfile))
    ERREXIT(cinfo, JERR_FILE_WRITE);
}